

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void resolveRelocationAndSmartSmc(aint immediateOffset,EType minType)

{
  pointer pTVar1;
  ulong uVar2;
  ulong uVar3;
  
  Relocation::resolveRelocationAffected(immediateOffset,minType);
  if (immediateOffset != 0x7fffffff) {
    if (smartSmcIndex != 0 &&
        sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_start !=
        sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar2 = ((long)smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (smartSmcIndex <= uVar2) {
        uVar3 = smartSmcIndex - 1;
        if (uVar2 < uVar3 || uVar2 - uVar3 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if ((((smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3].colBegin == 0xffffffff) &&
             (pTVar1 = smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar3,
             pTVar1->filename ==
             sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].filename)) &&
            (pTVar1->line ==
             sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].line)) &&
           (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].colBegin < 2)) {
          pTVar1->colBegin = immediateOffset;
        }
      }
    }
  }
  return;
}

Assistant:

void resolveRelocationAndSmartSmc(const aint immediateOffset, Relocation::EType minType) {
	// call relocation data generator to do its own errands
	Relocation::resolveRelocationAffected(immediateOffset, minType);
	// check smart-SMC functionality, if there is unresolved record to be set up
	if (INT_MAX == immediateOffset || sourcePosStack.empty() || 0 == smartSmcIndex) return;
	if (smartSmcLines.size() < smartSmcIndex) return;
	auto & smartSmc = smartSmcLines.at(smartSmcIndex - 1);
	if (~0U != smartSmc.colBegin || smartSmc != sourcePosStack.back()) return;
	if (1 < sourcePosStack.back().colBegin) return;		// only first segment belongs to SMC label
	// record does match current line, resolve the smart offset
	smartSmc.colBegin = immediateOffset;
}